

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O0

void anon_unknown.dwarf_1ab374::setInputFrameBuffer
               (FrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int> *uData,
               Array2D<float> *fData,Array2D<Imath_3_2::half> *hData,int width,int height)

{
  uint *puVar1;
  float *pfVar2;
  half *phVar3;
  Array2D<float> *in_RCX;
  Array2D<unsigned_int> *in_RDX;
  int in_ESI;
  char *in_RDI;
  Array2D<Imath_3_2::half> *in_R8;
  int in_R9D;
  long in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff08;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff10;
  Slice local_d8 [56];
  Slice local_a0 [56];
  Slice local_68 [60];
  int local_2c;
  Array2D<Imath_3_2::half> *local_28;
  Array2D<float> *local_20;
  Array2D<unsigned_int> *local_18;
  char *local_8;
  
  local_2c = in_R9D;
  local_8 = in_RDI;
  if (in_ESI == 0) {
    local_18 = in_RDX;
    Imf_3_2::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00);
    puVar1 = Imf_3_2::Array2D<unsigned_int>::operator[](local_18,0);
    Imf_3_2::Slice::Slice(local_68,UINT,(char *)puVar1,4,(long)local_2c << 2,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert(local_8,(Slice *)"UINT");
  }
  else if (in_ESI == 1) {
    local_20 = in_RCX;
    Imf_3_2::Array2D<float>::resizeErase
              ((Array2D<float> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00);
    pfVar2 = Imf_3_2::Array2D<float>::operator[](local_20,0);
    Imf_3_2::Slice::Slice(local_a0,FLOAT,(char *)pfVar2,4,(long)local_2c << 2,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert(local_8,(Slice *)"FLOAT");
  }
  else if (in_ESI == 2) {
    local_28 = in_R8;
    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    phVar3 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_28,0);
    Imf_3_2::Slice::Slice(local_d8,HALF,(char *)phVar3,2,(long)local_2c << 1,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert(local_8,(Slice *)"HALF");
  }
  return;
}

Assistant:

void
setInputFrameBuffer (
    FrameBuffer&           frameBuffer,
    int                    pixelType,
    Array2D<unsigned int>& uData,
    Array2D<float>&        fData,
    Array2D<half>&         hData,
    int                    width,
    int                    height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase (height, width);
            frameBuffer.insert (
                "UINT",
                Slice (
                    IMF::UINT,
                    (char*) (&uData[0][0]),
                    sizeof (uData[0][0]) * 1,
                    sizeof (uData[0][0]) * width,
                    1,
                    1,
                    0));
            break;
        case 1:
            fData.resizeErase (height, width);
            frameBuffer.insert (
                "FLOAT",
                Slice (
                    IMF::FLOAT,
                    (char*) (&fData[0][0]),
                    sizeof (fData[0][0]) * 1,
                    sizeof (fData[0][0]) * width,
                    1,
                    1,
                    0));
            break;
        case 2:
            hData.resizeErase (height, width);
            frameBuffer.insert (
                "HALF",
                Slice (
                    IMF::HALF,
                    (char*) (&hData[0][0]),
                    sizeof (hData[0][0]) * 1,
                    sizeof (hData[0][0]) * width,
                    1,
                    1,
                    0));
            break;
    }
}